

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

bool __thiscall
wasm::analysis::Vector<wasm::analysis::Bool>::meetAtIndex
          (Vector<wasm::analysis::Bool> *this,Element *meetee,size_t i,Element *elem)

{
  Element EVar1;
  bool bVar2;
  reference local_58;
  reference local_48;
  Element local_31;
  Element *pEStack_30;
  bool e;
  Element *elem_local;
  size_t i_local;
  Element *meetee_local;
  Vector<wasm::analysis::Bool> *this_local;
  
  pEStack_30 = elem;
  elem_local = (Element *)i;
  i_local = (size_t)meetee;
  meetee_local = (Element *)this;
  local_48 = std::vector<bool,_std::allocator<bool>_>::operator[](meetee,i);
  local_31 = std::_Bit_reference::operator_cast_to_bool(&local_48);
  bVar2 = Bool::meet((Bool *)this,&local_31,(Element)(*pEStack_30 & 1));
  EVar1 = local_31;
  if (bVar2) {
    local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)i_local,(size_type)elem_local);
    std::_Bit_reference::operator=(&local_58,(bool)(EVar1 & 1));
  }
  return bVar2;
}

Assistant:

bool meetAtIndex(Element& meetee,
                   size_t i,
                   const typename L::Element& elem) const noexcept {
    if constexpr (std::is_same_v<typename L::Element, bool>) {
      // The vector<bool> specialization does not expose references to the
      // individual bools because they might be in a bitmap, so we need a
      // workaround.
      bool e = meetee[i];
      if (lattice.meet(e, elem)) {
        meetee[i] = e;
        return true;
      }
      return false;
    } else {
      return lattice.meet(meetee[i], elem);
    }
  }